

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O1

void device_reset_multipcm(void *info)

{
  long lVar1;
  MultiPCM *ptChip;
  undefined1 *puVar2;
  
  puVar2 = (undefined1 *)((long)info + 8);
  lVar1 = 0;
  do {
    *puVar2 = (char)lVar1;
    puVar2[9] = 0;
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + 0x98;
  } while (lVar1 != 0x1c);
  return;
}

Assistant:

static void device_reset_multipcm(void *info)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	INT32 slot;
	
	for (slot = 0; slot < 28; ++slot)
	{
		ptChip->slots[slot].slot_index = slot;
		ptChip->slots[slot].playing = 0;
	}
	
	return;
}